

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pvip_node.c
# Opt level: O0

PVIPNode *
PVIP_node_new_number(PVIPParserContext *parser,PVIP_node_type_t type,char *str,size_t len)

{
  PVIP_category_t PVar1;
  PVIPNode *pPVar2;
  double dVar3;
  PVIPNode *node;
  size_t len_local;
  char *str_local;
  PVIP_node_type_t type_local;
  PVIPParserContext *parser_local;
  
  pPVar2 = pvip_node_alloc(parser->pvip);
  PVar1 = PVIP_node_category(type);
  if (PVar1 == PVIP_CATEGORY_NUMBER) {
    pPVar2->type = type;
    dVar3 = strtod(str,(char **)0x0);
    (pPVar2->field_2).nv = dVar3;
    pPVar2->line_number = 0;
    return pPVar2;
  }
  __assert_fail("PVIP_node_category(type) == PVIP_CATEGORY_NUMBER",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tokuhirom[P]pvip/src/pvip_node.c"
                ,0xbe,
                "PVIPNode *PVIP_node_new_number(PVIPParserContext *, PVIP_node_type_t, const char *, size_t)"
               );
}

Assistant:

PVIPNode* PVIP_node_new_number(PVIPParserContext* parser, PVIP_node_type_t type, const char *str, size_t len) {
    PVIPNode *node = pvip_node_alloc(parser->pvip);
    assert(PVIP_node_category(type) == PVIP_CATEGORY_NUMBER);
    node->type = type;
    node->nv = strtod(str, NULL);
    node->line_number = 0;
    return node;
}